

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O2

bool duckdb::Varint::VarcharFormatting
               (string_t *value,idx_t *start_pos,idx_t *end_pos,bool *is_negative,bool *is_zero)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  
  if ((value->value).pointer.length == 0) {
    return false;
  }
  *start_pos = 0;
  *is_zero = false;
  uVar4 = (ulong)(value->value).pointer.length;
  if (uVar4 < 0xd) {
    pcVar6 = (value->value).pointer.prefix;
  }
  else {
    pcVar6 = (value->value).pointer.ptr;
  }
  *end_pos = uVar4;
  cVar1 = *pcVar6;
  *is_negative = cVar1 == '-';
  uVar4 = *start_pos;
  if (cVar1 == '-') {
    uVar4 = uVar4 + 1;
    *start_pos = uVar4;
  }
  bVar7 = false;
  bVar3 = false;
  if (*pcVar6 != '+') goto LAB_016ef0cf;
  do {
    bVar7 = bVar3;
    uVar4 = uVar4 + 1;
    *start_pos = uVar4;
LAB_016ef0cf:
    uVar2 = *end_pos;
  } while ((uVar4 < uVar2) && (bVar3 = true, pcVar6[uVar4] == '0'));
  if (uVar4 == uVar2) {
    if (!bVar7) {
      return false;
    }
    *is_zero = true;
  }
  else {
    for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      if (9 < (int)pcVar6[uVar4] - 0x30U) {
        uVar5 = uVar4;
        if (pcVar6[uVar4] != '.') {
          return false;
        }
        do {
          uVar5 = uVar5 + 1;
          if (uVar2 <= uVar5) {
            *end_pos = uVar4;
            return true;
          }
        } while ((int)pcVar6[uVar5] - 0x30U < 10);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool Empty() const {
		return value.inlined.length == 0;
	}